

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_file_block_manager.cpp
# Opt level: O1

idx_t __thiscall duckdb::SingleFileBlockManager::FreeBlocks(SingleFileBlockManager *this)

{
  idx_t iVar1;
  int iVar2;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->block_lock);
  if (iVar2 == 0) {
    iVar1 = (this->free_list)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    pthread_mutex_unlock((pthread_mutex_t *)&this->block_lock);
    return iVar1;
  }
  ::std::__throw_system_error(iVar2);
}

Assistant:

idx_t SingleFileBlockManager::FreeBlocks() {
	lock_guard<mutex> lock(block_lock);
	return free_list.size();
}